

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Preprocessor.cpp
# Opt level: O0

Trivia __thiscall
slang::parsing::Preprocessor::parseBranchDirective
          (Preprocessor *this,Token directive,Token condition,bool taken)

{
  BumpAllocator *pBVar1;
  Token TVar2;
  bool bVar3;
  SyntaxKind SVar4;
  int iVar5;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  EVP_PKEY_CTX *src;
  EVP_PKEY_CTX *src_00;
  span<slang::parsing::Token,_18446744073709551615UL> local_a8;
  SyntaxKind local_94;
  span<slang::parsing::Token,_18446744073709551615UL> local_90;
  SyntaxKind local_7c;
  ConditionalBranchDirectiveSyntax *local_78;
  SyntaxNode *syntax;
  DiagCode local_5e;
  byte local_59;
  undefined1 auStack_58 [7];
  bool done;
  Token token;
  bool taken_local;
  Preprocessor *this_local;
  Token condition_local;
  Token directive_local;
  
  condition_local._0_8_ = condition.info;
  this_local = condition._0_8_;
  directive_local._0_8_ = directive.info;
  condition_local.info = directive._0_8_;
  token.info._7_1_ = taken;
  SmallVectorBase<slang::parsing::Token>::clear
            (&(this->scratchTokenBuffer).super_SmallVectorBase<slang::parsing::Token>);
  if ((token.info._7_1_ & 1) == 0) {
    while( true ) {
      _auStack_58 = nextRaw(this);
      local_59 = 0;
      if (auStack_58._0_2_ == EndOfFile) {
        local_5e.subsystem = Preprocessor;
        local_5e.code = 0x12;
        _syntax = Token::range((Token *)&condition_local.info);
        addDiag(this,local_5e,_syntax);
        local_59 = 1;
      }
      else if ((auStack_58._0_2_ == Directive) &&
              ((((SVar4 = Token::directiveKind((Token *)auStack_58), SVar4 == ElsIfDirective ||
                 (SVar4 == ElseDirective)) || (SVar4 == EndIfDirective)) ||
               ((SVar4 == IfDefDirective || (SVar4 == IfNDefDirective)))))) {
        local_59 = 1;
      }
      TVar2 = _auStack_58;
      if ((local_59 & 1) != 0) break;
      SmallVectorBase<slang::parsing::Token>::push_back
                (&(this->scratchTokenBuffer).super_SmallVectorBase<slang::parsing::Token>,
                 (Token *)auStack_58);
    }
    (this->currentToken).kind = auStack_58._0_2_;
    (this->currentToken).field_0x2 = auStack_58[2];
    (this->currentToken).numFlags = (NumericTokenFlags)auStack_58[3];
    (this->currentToken).rawLen = stack0xffffffffffffffac;
    token._0_8_ = TVar2.info;
    (this->currentToken).info = (Info *)token._0_8_;
    _auStack_58 = TVar2;
  }
  bVar3 = Token::operator_cast_to_bool((Token *)&this_local);
  if (bVar3) {
    pBVar1 = this->alloc;
    local_7c = Token::directiveKind((Token *)&condition_local.info);
    iVar5 = SmallVectorBase<slang::parsing::Token>::copy
                      (&(this->scratchTokenBuffer).super_SmallVectorBase<slang::parsing::Token>,
                       (EVP_PKEY_CTX *)this->alloc,src);
    local_90.data_ = (pointer)CONCAT44(extraout_var,iVar5);
    local_78 = BumpAllocator::
               emplace<slang::syntax::ConditionalBranchDirectiveSyntax,slang::syntax::SyntaxKind,slang::parsing::Token&,slang::parsing::Token&,nonstd::span_lite::span<slang::parsing::Token,18446744073709551615ul>>
                         (pBVar1,&local_7c,(Token *)&condition_local.info,(Token *)&this_local,
                          &local_90);
  }
  else {
    pBVar1 = this->alloc;
    local_94 = Token::directiveKind((Token *)&condition_local.info);
    iVar5 = SmallVectorBase<slang::parsing::Token>::copy
                      (&(this->scratchTokenBuffer).super_SmallVectorBase<slang::parsing::Token>,
                       (EVP_PKEY_CTX *)this->alloc,src_00);
    local_a8.data_ = (pointer)CONCAT44(extraout_var_00,iVar5);
    local_78 = (ConditionalBranchDirectiveSyntax *)
               BumpAllocator::
               emplace<slang::syntax::UnconditionalBranchDirectiveSyntax,slang::syntax::SyntaxKind,slang::parsing::Token&,nonstd::span_lite::span<slang::parsing::Token,18446744073709551615ul>>
                         (pBVar1,&local_94,(Token *)&condition_local.info,&local_a8);
  }
  Trivia::Trivia((Trivia *)&directive_local.info,Directive,(SyntaxNode *)local_78);
  return stack0xffffffffffffffe8;
}

Assistant:

Trivia Preprocessor::parseBranchDirective(Token directive, Token condition, bool taken) {
    scratchTokenBuffer.clear();
    if (!taken) {
        // skip over everything until we find another conditional compilation directive
        while (true) {
            auto token = nextRaw();

            // EoF or conditional directive stops the skipping process
            bool done = false;
            if (token.kind == TokenKind::EndOfFile) {
                addDiag(diag::MissingEndIfDirective, directive.range());
                done = true;
            }
            else if (token.kind == TokenKind::Directive) {
                switch (token.directiveKind()) {
                    case SyntaxKind::IfDefDirective:
                    case SyntaxKind::IfNDefDirective:
                    case SyntaxKind::ElsIfDirective:
                    case SyntaxKind::ElseDirective:
                    case SyntaxKind::EndIfDirective:
                        done = true;
                        break;
                    default:
                        break;
                }
            }

            if (done) {
                // put the token back so that we'll look at it next
                currentToken = token;
                break;
            }
            scratchTokenBuffer.push_back(token);
        }
    }

    SyntaxNode* syntax;
    if (condition) {
        syntax = alloc.emplace<ConditionalBranchDirectiveSyntax>(directive.directiveKind(),
                                                                 directive, condition,
                                                                 scratchTokenBuffer.copy(alloc));
    }
    else {
        syntax = alloc.emplace<UnconditionalBranchDirectiveSyntax>(directive.directiveKind(),
                                                                   directive,
                                                                   scratchTokenBuffer.copy(alloc));
    }
    return Trivia(TriviaKind::Directive, syntax);
}